

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O3

int hts_idx_push(hts_idx_t *idx,int tid,int beg,int end,uint64_t offset,int is_mapped)

{
  byte bVar1;
  khint32_t key;
  kh_bin_t *pkVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  int iVar6;
  khint_t kVar7;
  uint uVar8;
  uint32_t uVar9;
  bidx_t **ppbVar10;
  lidx_t *plVar11;
  hts_pair64_t *phVar12;
  bidx_t *pbVar13;
  uint64_t *puVar14;
  int32_t iVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  bins_t *pbVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  uint32_t uVar23;
  long lVar24;
  int absent;
  int absent_1;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  int local_3c;
  int local_38;
  int local_34;
  
  uVar20 = (ulong)(uint)tid;
  iVar18 = 0;
  if (-1 < tid) {
    iVar18 = end;
  }
  iVar5 = -1;
  if (-1 < tid) {
    iVar5 = beg;
  }
  iVar17 = idx->m;
  lVar24 = (long)iVar17;
  if (iVar17 <= tid) {
    iVar6 = 2;
    if (iVar17 != 0) {
      iVar6 = iVar17 * 2;
    }
    idx->m = iVar6;
    ppbVar10 = (bidx_t **)realloc(idx->bidx,(long)iVar6 << 3);
    idx->bidx = ppbVar10;
    plVar11 = (lidx_t *)realloc(idx->lidx,(long)idx->m << 4);
    idx->lidx = plVar11;
    memset(idx->bidx + lVar24,0,(idx->m - lVar24) * 8);
    memset(idx->lidx + lVar24,0,(idx->m - lVar24) * 0x10);
  }
  if (idx->n <= tid) {
    idx->n = tid + 1;
  }
  if ((idx->z).finished != 0) {
    return 0;
  }
  iVar17 = (idx->z).last_tid;
  if ((iVar17 == tid) && (-1 < tid || iVar17 < 0)) {
    if (tid < 0) {
LAB_0010f772:
      idx->n_no_coor = idx->n_no_coor + 1;
      goto LAB_0010f776;
    }
    if (beg < (idx->z).last_coor) {
      if (hts_verbose < 1) {
        return -1;
      }
      hts_idx_push_cold_1();
      return -1;
    }
    ppbVar10 = idx->bidx;
    if (ppbVar10[uVar20] == (bidx_t *)0x0) goto LAB_0010f8e7;
  }
  else {
    if (tid < 0) {
      (idx->z).last_tid = tid;
      (idx->z).last_bin = 0xffffffff;
      goto LAB_0010f772;
    }
    if (idx->n_no_coor != 0) {
      if (hts_verbose < 1) {
        return -1;
      }
      fprintf(_stderr,"[E::%s] NO_COOR reads not in a single block at the end %d %d\n",
              "hts_idx_push",uVar20);
      return -1;
    }
    ppbVar10 = idx->bidx;
    if (ppbVar10[uVar20] != (bidx_t *)0x0) {
      if (hts_verbose < 1) {
        return -1;
      }
      hts_idx_push_cold_2();
      return -1;
    }
    (idx->z).last_tid = tid;
    (idx->z).last_bin = 0xffffffff;
LAB_0010f8e7:
    pbVar13 = (bidx_t *)calloc(1,0x28);
    ppbVar10[uVar20] = pbVar13;
  }
  if (is_mapped != 0) {
    bVar1 = (byte)idx->min_shift;
    lVar24 = (long)beg >> (bVar1 & 0x3f);
    plVar11 = idx->lidx + uVar20;
    uVar3 = (idx->z).last_off;
    iVar17 = idx->lidx[uVar20].m;
    uVar22 = (uint)((long)end + -1 >> (bVar1 & 0x3f));
    if (iVar17 <= (int)uVar22) {
      uVar8 = (int)uVar22 >> 1 | uVar22;
      uVar8 = (int)uVar8 >> 2 | uVar8;
      uVar8 = (int)uVar8 >> 4 | uVar8;
      uVar8 = (int)uVar8 >> 8 | uVar8;
      uVar8 = (int)uVar8 >> 0x10 | uVar8;
      plVar11->m = uVar8 + 1;
      puVar14 = (uint64_t *)realloc(plVar11->offset,(long)(int)uVar8 * 8 + 8);
      plVar11->offset = puVar14;
      memset(puVar14 + iVar17,0xff,((long)plVar11->m - (long)iVar17) * 8);
    }
    uVar8 = (uint)lVar24;
    if (uVar8 == uVar22) {
      if (plVar11->offset[lVar24] == 0xffffffffffffffff) {
        plVar11->offset[lVar24] = uVar3;
      }
    }
    else if ((int)uVar8 <= (int)uVar22) {
      puVar14 = plVar11->offset;
      lVar16 = 0;
      do {
        if (puVar14[lVar24 + lVar16] == 0xffffffffffffffff) {
          puVar14[lVar24 + lVar16] = uVar3;
        }
        lVar16 = lVar16 + 1;
      } while ((uVar22 - uVar8) + 1 != (int)lVar16);
    }
    if (plVar11->n <= (int)uVar22) {
      plVar11->n = uVar22 + 1;
    }
  }
LAB_0010f776:
  iVar17 = idx->n_lvls;
  uVar23 = 0;
  if (0 < iVar17) {
    iVar6 = idx->min_shift;
    uVar20 = (ulong)(uint)~(-1 << ((char)iVar17 * '\x03' & 0x1fU)) * 0x92492493 >> 0x22;
    iVar21 = iVar17 + 1;
    iVar17 = iVar17 * 3;
    do {
      iVar17 = iVar17 + -3;
      lVar24 = (long)iVar5 >> ((byte)iVar6 & 0x3f);
      if (lVar24 == (long)iVar18 + -1 >> ((byte)iVar6 & 0x3f)) {
        uVar23 = (int)uVar20 + (int)lVar24;
        break;
      }
      iVar6 = iVar6 + 3;
      uVar20 = (ulong)(uint)((int)uVar20 + (-1 << ((byte)iVar17 & 0x1f)));
      iVar21 = iVar21 + -1;
      uVar23 = 0;
    } while (1 < iVar21);
  }
  uVar9 = (idx->z).last_bin;
  if (uVar9 != uVar23) {
    key = (idx->z).save_bin;
    if (key != 0xffffffff) {
      pkVar2 = idx->bidx[(idx->z).save_tid];
      uVar3 = (idx->z).last_off;
      uVar4 = (idx->z).save_off;
      kVar7 = kh_put_bin(pkVar2,key,&local_3c);
      pbVar19 = pkVar2->vals + kVar7;
      if (local_3c == 0) {
        iVar15 = pbVar19->n;
        if (iVar15 == pbVar19->m) {
          pbVar19->m = iVar15 * 2;
          phVar12 = (hts_pair64_t *)realloc(pbVar19->list,(long)(iVar15 * 2) << 4);
          pbVar19->list = phVar12;
          iVar15 = pbVar19->n;
        }
        else {
          phVar12 = pbVar19->list;
        }
      }
      else {
        pbVar19->m = 1;
        phVar12 = (hts_pair64_t *)calloc(1,0x10);
        pbVar19->list = phVar12;
        iVar15 = 0;
      }
      pbVar19->n = iVar15 + 1;
      local_68 = (undefined4)uVar3;
      uStack_64 = (undefined4)(uVar3 >> 0x20);
      uStack_60 = (undefined4)uVar4;
      phVar12 = phVar12 + iVar15;
      *(undefined4 *)&phVar12->u = uStack_60;
      *(undefined4 *)((long)&phVar12->u + 4) = uStack_64;
      *(undefined4 *)&phVar12->v = local_68;
      *(undefined4 *)((long)&phVar12->v + 4) = uStack_64;
      uVar9 = (idx->z).last_bin;
    }
    if ((uVar9 == 0xffffffff) && ((idx->z).save_bin != 0xffffffff)) {
      uVar3 = (idx->z).last_off;
      (idx->z).off_end = uVar3;
      pkVar2 = idx->bidx[(idx->z).save_tid];
      uVar4 = (idx->z).off_beg;
      kVar7 = kh_put_bin(pkVar2,idx->n_bins + 1,&local_38);
      pbVar19 = pkVar2->vals + kVar7;
      if (local_38 == 0) {
        iVar15 = pbVar19->n;
        if (iVar15 == pbVar19->m) {
          pbVar19->m = iVar15 * 2;
          phVar12 = (hts_pair64_t *)realloc(pbVar19->list,(long)(iVar15 * 2) << 4);
          pbVar19->list = phVar12;
          iVar15 = pbVar19->n;
        }
        else {
          phVar12 = pbVar19->list;
        }
      }
      else {
        pbVar19->m = 1;
        phVar12 = (hts_pair64_t *)calloc(1,0x10);
        pbVar19->list = phVar12;
        iVar15 = 0;
      }
      phVar12[iVar15].u = uVar4;
      pbVar19->n = iVar15 + 1;
      phVar12[iVar15].v = uVar3;
      pkVar2 = idx->bidx[(idx->z).save_tid];
      uVar3 = (idx->z).n_mapped;
      uVar4 = (idx->z).n_unmapped;
      kVar7 = kh_put_bin(pkVar2,idx->n_bins + 1,&local_34);
      pbVar19 = pkVar2->vals + kVar7;
      if (local_34 == 0) {
        iVar15 = pbVar19->n;
        if (iVar15 == pbVar19->m) {
          pbVar19->m = iVar15 * 2;
          phVar12 = (hts_pair64_t *)realloc(pbVar19->list,(long)(iVar15 * 2) << 4);
          pbVar19->list = phVar12;
          iVar15 = pbVar19->n;
        }
        else {
          phVar12 = pbVar19->list;
        }
      }
      else {
        pbVar19->m = 1;
        phVar12 = (hts_pair64_t *)calloc(1,0x10);
        pbVar19->list = phVar12;
        iVar15 = 0;
      }
      pbVar19->n = iVar15 + 1;
      phVar12[iVar15].u = uVar3;
      phVar12[iVar15].v = uVar4;
      (idx->z).n_mapped = 0;
      (idx->z).n_unmapped = 0;
      (idx->z).off_beg = (idx->z).off_end;
    }
    (idx->z).save_off = (idx->z).last_off;
    (idx->z).last_bin = uVar23;
    (idx->z).save_bin = uVar23;
    (idx->z).save_tid = tid;
  }
  puVar14 = &(idx->z).n_mapped + (is_mapped == 0);
  *puVar14 = *puVar14 + 1;
  (idx->z).last_off = offset;
  (idx->z).last_coor = iVar5;
  return 0;
}

Assistant:

int hts_idx_push(hts_idx_t *idx, int tid, int beg, int end, uint64_t offset, int is_mapped)
{
    int bin;
    if (tid<0) beg = -1, end = 0;
    if (tid >= idx->m) { // enlarge the index
        int32_t oldm = idx->m;
        idx->m = idx->m? idx->m<<1 : 2;
        idx->bidx = (bidx_t**)realloc(idx->bidx, idx->m * sizeof(bidx_t*));
        idx->lidx = (lidx_t*) realloc(idx->lidx, idx->m * sizeof(lidx_t));
        memset(&idx->bidx[oldm], 0, (idx->m - oldm) * sizeof(bidx_t*));
        memset(&idx->lidx[oldm], 0, (idx->m - oldm) * sizeof(lidx_t));
    }
    if (idx->n < tid + 1) idx->n = tid + 1;
    if (idx->z.finished) return 0;
    if (idx->z.last_tid != tid || (idx->z.last_tid >= 0 && tid < 0)) { // change of chromosome
        if ( tid>=0 && idx->n_no_coor )
        {
            if (hts_verbose >= 1) fprintf(stderr,"[E::%s] NO_COOR reads not in a single block at the end %d %d\n", __func__, tid,idx->z.last_tid);
            return -1;
        }
        if (tid>=0 && idx->bidx[tid] != 0)
        {
            if (hts_verbose >= 1) fprintf(stderr, "[E::%s] chromosome blocks not continuous\n", __func__);
            return -1;
        }
        idx->z.last_tid = tid;
        idx->z.last_bin = 0xffffffffu;
    } else if (tid >= 0 && idx->z.last_coor > beg) { // test if positions are out of order
        if (hts_verbose >= 1) fprintf(stderr, "[E::%s] unsorted positions\n", __func__);
        return -1;
    }
    if ( tid>=0 )
    {
        if (idx->bidx[tid] == 0) idx->bidx[tid] = kh_init(bin);
        if ( is_mapped)
            insert_to_l(&idx->lidx[tid], beg, end, idx->z.last_off, idx->min_shift); // last_off points to the start of the current record
    }
    else idx->n_no_coor++;
    bin = hts_reg2bin(beg, end, idx->min_shift, idx->n_lvls);
    if ((int)idx->z.last_bin != bin) { // then possibly write the binning index
        if (idx->z.save_bin != 0xffffffffu) // save_bin==0xffffffffu only happens to the first record
            insert_to_b(idx->bidx[idx->z.save_tid], idx->z.save_bin, idx->z.save_off, idx->z.last_off);
        if (idx->z.last_bin == 0xffffffffu && idx->z.save_bin != 0xffffffffu) { // change of chr; keep meta information
            idx->z.off_end = idx->z.last_off;
            insert_to_b(idx->bidx[idx->z.save_tid], META_BIN(idx), idx->z.off_beg, idx->z.off_end);
            insert_to_b(idx->bidx[idx->z.save_tid], META_BIN(idx), idx->z.n_mapped, idx->z.n_unmapped);
            idx->z.n_mapped = idx->z.n_unmapped = 0;
            idx->z.off_beg = idx->z.off_end;
        }
        idx->z.save_off = idx->z.last_off;
        idx->z.save_bin = idx->z.last_bin = bin;
        idx->z.save_tid = tid;
    }
    if (is_mapped) ++idx->z.n_mapped;
    else ++idx->z.n_unmapped;
    idx->z.last_off = offset;
    idx->z.last_coor = beg;
    return 0;
}